

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

ConditionBinsSelectExpr * __thiscall
slang::BumpAllocator::emplace<slang::ast::ConditionBinsSelectExpr,slang::ast::Symbol_const&>
          (BumpAllocator *this,Symbol *args)

{
  ConditionBinsSelectExpr *pCVar1;
  
  pCVar1 = (ConditionBinsSelectExpr *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ConditionBinsSelectExpr *)this->endPtr < pCVar1 + 1) {
    pCVar1 = (ConditionBinsSelectExpr *)allocateSlow(this,0x28,8);
  }
  else {
    this->head->current = (byte *)(pCVar1 + 1);
  }
  (pCVar1->super_BinsSelectExpr).kind = Condition;
  (pCVar1->super_BinsSelectExpr).syntax = (SyntaxNode *)0x0;
  pCVar1->target = args;
  (pCVar1->intersects)._M_ptr = (pointer)0x0;
  (pCVar1->intersects)._M_extent._M_extent_value = 0;
  return pCVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }